

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxIfStatement::Emit(FxIfStatement *this,VMFunctionBuilder *build)

{
  int iVar1;
  ExpEmit EVar2;
  size_t loc;
  TArray<unsigned_long,_unsigned_long> no;
  TArray<unsigned_long,_unsigned_long> yes;
  TArray<unsigned_long,_unsigned_long> local_38;
  TArray<unsigned_long,_unsigned_long> local_28;
  
  local_28.Array = (unsigned_long *)0x0;
  local_28.Most = 0;
  local_28.Count = 0;
  local_38.Array = (unsigned_long *)0x0;
  local_38.Most = 0;
  local_38.Count = 0;
  (*this->Condition->_vptr_FxExpression[10])
            (this->Condition,build,(ulong)(this->WhenTrue == (FxExpression *)0x0));
  if (this->WhenTrue != (FxExpression *)0x0) {
    VMFunctionBuilder::BackpatchListToHere(build,&local_28);
    FxExpression::EmitStatement(this->WhenTrue,build);
  }
  if (this->WhenFalse != (FxExpression *)0x0) {
    loc = 0xffffffff;
    if (this->WhenTrue != (FxExpression *)0x0) {
      iVar1 = (*this->WhenTrue->_vptr_FxExpression[7])();
      if ((char)iVar1 == '\0') {
        loc = VMFunctionBuilder::Emit(build,0x44,0);
      }
      VMFunctionBuilder::BackpatchListToHere(build,&local_38);
    }
    FxExpression::EmitStatement(this->WhenFalse,build);
    if (loc != 0xffffffff) {
      VMFunctionBuilder::BackpatchToHere(build,loc);
    }
    if (this->WhenTrue != (FxExpression *)0x0) goto LAB_0053a477;
  }
  VMFunctionBuilder::BackpatchListToHere(build,&local_38);
LAB_0053a477:
  TArray<unsigned_long,_unsigned_long>::~TArray(&local_38);
  TArray<unsigned_long,_unsigned_long>::~TArray(&local_28);
  EVar2.RegNum = 0;
  EVar2.RegType = 0x80;
  EVar2.RegCount = '\x01';
  EVar2.Konst = false;
  EVar2.Fixed = false;
  EVar2.Final = false;
  EVar2.Target = false;
  return EVar2;
}

Assistant:

ExpEmit FxIfStatement::Emit(VMFunctionBuilder *build)
{
	ExpEmit v;
	size_t jumpspot = ~0u;

	TArray<size_t> yes, no;
	Condition->EmitCompare(build, WhenTrue == nullptr, yes, no);

	if (WhenTrue != nullptr)
	{
		build->BackpatchListToHere(yes);
		WhenTrue->EmitStatement(build);
	}
	if (WhenFalse != nullptr)
	{
		if (WhenTrue != nullptr)
		{
			if (!WhenTrue->CheckReturn()) jumpspot = build->Emit(OP_JMP, 0);	// no need to emit a jump if the block returns.
			build->BackpatchListToHere(no);
		}
		WhenFalse->EmitStatement(build);
		if (jumpspot != ~0u) build->BackpatchToHere(jumpspot);
		if (WhenTrue == nullptr) build->BackpatchListToHere(no);
	}
	else
	{
		build->BackpatchListToHere(no);
	}
	return ExpEmit();
}